

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

char * ures_toUTF8String(UChar *s16,int32_t length16,char *dest,int32_t *pLength,UBool forceCopy,
                        UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int local_44;
  int32_t maxLength;
  int32_t capacity;
  UErrorCode *status_local;
  UBool forceCopy_local;
  int32_t *pLength_local;
  char *dest_local;
  int32_t length16_local;
  UChar *s16_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (pLength == (int32_t *)0x0) {
      local_44 = 0;
    }
    else {
      local_44 = *pLength;
    }
    if ((local_44 < 0) || ((0 < local_44 && (dest == (char *)0x0)))) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      s16_local = (UChar *)0x0;
    }
    else if (length16 == 0) {
      if (pLength != (int32_t *)0x0) {
        *pLength = 0;
      }
      if (forceCopy == '\0') {
        s16_local = L"";
      }
      else {
        u_terminateChars_63(dest,local_44,0,status);
        s16_local = (UChar *)dest;
      }
    }
    else if (local_44 < length16) {
      s16_local = (UChar *)u_strToUTF8_63((char *)0x0,0,pLength,s16,length16,status);
    }
    else {
      pLength_local = (int32_t *)dest;
      if (((forceCopy == '\0') && (length16 < 0x2aaaaaab)) &&
         (iVar2 = length16 * 3 + 1, iVar2 < local_44)) {
        pLength_local = (int32_t *)(dest + (local_44 - iVar2));
        local_44 = iVar2;
      }
      s16_local = (UChar *)u_strToUTF8_63((char *)pLength_local,local_44,pLength,s16,length16,status
                                         );
    }
  }
  else {
    s16_local = (UChar *)0x0;
  }
  return (char *)s16_local;
}

Assistant:

static const char *
ures_toUTF8String(const UChar *s16, int32_t length16,
                  char *dest, int32_t *pLength,
                  UBool forceCopy,
                  UErrorCode *status) {
    int32_t capacity;

    if (U_FAILURE(*status)) {
        return NULL;
    }
    if (pLength != NULL) {
        capacity = *pLength;
    } else {
        capacity = 0;
    }
    if (capacity < 0 || (capacity > 0 && dest == NULL)) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if (length16 == 0) {
        /* empty string, return as read-only pointer */
        if (pLength != NULL) {
            *pLength = 0;
        }
        if (forceCopy) {
            u_terminateChars(dest, capacity, 0, status);
            return dest;
        } else {
            return "";
        }
    } else {
        /* We need to transform the string to the destination buffer. */
        if (capacity < length16) {
            /* No chance for the string to fit. Pure preflighting. */
            return u_strToUTF8(NULL, 0, pLength, s16, length16, status);
        }
        if (!forceCopy && (length16 <= 0x2aaaaaaa)) {
            /*
             * We know the string will fit into dest because each UChar turns
             * into at most three UTF-8 bytes. Fill the latter part of dest
             * so that callers do not expect to use dest as a string pointer,
             * hopefully leading to more robust code for when resource bundles
             * may store UTF-8 natively.
             * (In which case dest would not be used at all.)
             *
             * We do not do this if forceCopy=TRUE because then the caller
             * expects the string to start exactly at dest.
             *
             * The test above for <= 0x2aaaaaaa prevents overflows.
             * The +1 is for the NUL terminator.
             */
            int32_t maxLength = 3 * length16 + 1;
            if (capacity > maxLength) {
                dest += capacity - maxLength;
                capacity = maxLength;
            }
        }
        return u_strToUTF8(dest, capacity, pLength, s16, length16, status);
    }
}